

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O0

Vec_Vec_t * Cgt_ManDecideArea(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar5;
  Vec_Vec_t *p_00;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  float fVar9;
  abctime clk;
  int local_48;
  int Counter;
  int k;
  int i;
  Aig_Obj_t *pGate;
  Vec_Ptr_t *vOne;
  Vec_Ptr_t *vCompletes;
  Vec_Vec_t *vGates;
  int fVerbose_local;
  int nOdcMax_local;
  Vec_Vec_t *vGatesAll_local;
  Aig_Man_t *pAig_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  p = Cgt_ManCompleteGates(pAig,vGatesAll,nOdcMax,fVerbose);
  for (Counter = 0; iVar1 = Vec_PtrSize(p), Counter < iVar1; Counter = Counter + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,Counter);
    pAVar5 = Aig_Regular(pAVar5);
    *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef | 0x10;
  }
  iVar1 = Saig_ManRegNum(pAig);
  p_00 = Vec_VecStart(iVar1);
  for (Counter = 0; iVar1 = Vec_VecSize(vGatesAll), Counter < iVar1; Counter = Counter + 1) {
    local_48 = 0;
    while( true ) {
      pVVar6 = Vec_VecEntry(vGatesAll,Counter);
      iVar1 = Vec_PtrSize(pVVar6);
      if (iVar1 <= local_48) break;
      pVVar6 = Vec_VecEntry(vGatesAll,Counter);
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,local_48);
      pAVar7 = Aig_Regular(pAVar5);
      if ((*(ulong *)&pAVar7->field_0x18 >> 4 & 1) != 0) {
        Vec_VecPush(p_00,Counter,pAVar5);
      }
      local_48 = local_48 + 1;
    }
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(p), Counter < iVar1; Counter = Counter + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,Counter);
    pAVar5 = Aig_Regular(pAVar5);
    *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef;
  }
  for (Counter = 0; iVar1 = Vec_VecSize(p_00), Counter < iVar1; Counter = Counter + 1) {
    pVVar6 = Vec_VecEntry(p_00,Counter);
    iVar1 = Vec_PtrSize(pVVar6);
    clk._4_4_ = (0 < iVar1) + clk._4_4_;
  }
  if (fVerbose != 0) {
    uVar2 = Vec_VecSizeSize(vGatesAll);
    uVar3 = Saig_ManRegNum(pAig);
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",(ulong)uVar2,
           (ulong)clk._4_4_,(ulong)uVar3);
    uVar2 = Vec_PtrSize(p);
    fVar9 = Cgt_ManComputeCoverage(pAig,p_00);
    printf("Complete gates = %6d. Gated transitions = %5.2f %%. ",(double)fVar9,(ulong)uVar2);
    Abc_Print(1,"%s =","Time");
    aVar8 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar4) * 1.0) / 1000000.0);
  }
  Vec_PtrFree(p);
  return p_00;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideArea( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCompletes, * vOne;
    Aig_Obj_t * pGate;
    int i, k, Counter = 0;
    abctime clk = Abc_Clock();
    // derive and label complete gates
    vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
    // label complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 1;
    // select only complete gates
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    Vec_VecForEachEntry( Aig_Obj_t *, vGatesAll, pGate, i, k )
        if ( Aig_Regular(pGate)->fMarkA )
            Vec_VecPush( vGates, i, pGate );
    // unlabel complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 0;
    // count the number of gated flops
    Vec_VecForEachLevel( vGates, vOne, i )
    {
        Counter += (int)(Vec_PtrSize(vOne) > 0);
//        printf( "%d ", Vec_PtrSize(vOne) );
    }
//    printf( "\n" );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
        printf( "Complete gates = %6d. Gated transitions = %5.2f %%. ", 
            Vec_PtrSize(vCompletes), Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vCompletes );
    return vGates;
}